

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O2

user_options * user_options::get(user_options *__return_storage_ptr__,int argc,tchar **argv)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"pstore prime number generator\n",&local_39);
  pstore::command_line::parse_command_line_options(argc,argv,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (__return_storage_ptr__->output)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->output).field_2;
  (__return_storage_ptr__->output)._M_string_length = 0;
  (__return_storage_ptr__->output).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->endianness = (anonymous_namespace)::endian_opt._136_4_;
  __return_storage_ptr__->maximum = (ulong)(uint)(anonymous_namespace)::maximum_opt._136_4_;
  return __return_storage_ptr__;
}

Assistant:

user_options user_options::get (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore prime number generator\n");

    user_options result;
    result.output = output_opt.get ();
    result.endianness = endian_opt.get ();
    result.maximum = maximum_opt.get ();
    return result;
}